

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_add_range_closed(roaring_bitmap_t *r,uint32_t min,uint32_t max)

{
  uint16_t *__src;
  uint8_t uVar1;
  ushort uVar2;
  uint16_t *puVar3;
  uint8_t *puVar4;
  uint uVar5;
  int32_t iVar6;
  shared_container_t *sc;
  array_container_t *paVar7;
  byte bVar8;
  uint in_ECX;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  roaring_bitmap_t *prVar14;
  array_container_t *paVar15;
  array_container_t *paVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  int iVar27;
  ushort uVar28;
  ushort uVar29;
  uint uVar30;
  byte bVar31;
  bool bVar32;
  uint8_t new_type;
  int32_t union_cardinality;
  uint8_t local_75;
  uint local_74;
  ulong local_70;
  array_container_t *local_68;
  uint local_5c;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  uint32_t local_40;
  uint32_t local_3c;
  ulong local_38;
  roaring_bitmap_t *prVar20;
  
  if (min <= max) {
    uVar30 = min >> 0x10;
    uVar25 = (ulong)uVar30;
    uVar5 = max >> 0x10;
    puVar3 = (r->high_low_container).keys;
    uVar9 = (r->high_low_container).size;
    uVar23 = 0;
    uVar18 = 0;
    prVar20 = r;
    if (uVar9 != 0) {
      prVar14 = (roaring_bitmap_t *)(ulong)(uVar9 - 1);
      uVar18 = 0;
      do {
        if ((int)prVar14 < (int)uVar18) {
          uVar17 = ~uVar18;
          break;
        }
        uVar21 = uVar18 + (int)prVar14;
        uVar17 = uVar21 >> 1;
        prVar20 = (roaring_bitmap_t *)(ulong)uVar17;
        uVar29 = *(ushort *)((long)puVar3 + (ulong)(uVar21 & 0xfffffffe));
        local_5c._0_2_ = (ushort)(max >> 0x10);
        if (uVar29 < (ushort)local_5c) {
          uVar18 = uVar17 + 1;
          bVar32 = true;
          prVar20 = (roaring_bitmap_t *)(ulong)uVar18;
          uVar17 = in_ECX;
        }
        else if ((ushort)local_5c < uVar29) {
          prVar14 = (roaring_bitmap_t *)(ulong)(uVar17 - 1);
          bVar32 = true;
          prVar20 = prVar14;
          uVar17 = in_ECX;
        }
        else {
          bVar32 = false;
        }
        in_ECX = uVar17;
      } while (bVar32);
      uVar18 = uVar17 + 1;
      if (-1 < (int)uVar17) {
        uVar18 = ~uVar17;
      }
      uVar18 = uVar18 + uVar9;
    }
    if (uVar9 != uVar18) {
      iVar12 = uVar9 + ~uVar18;
      uVar17 = 0;
      do {
        if (iVar12 < (int)uVar17) {
          uVar23 = ~uVar17;
          break;
        }
        uVar23 = uVar17 + iVar12 >> 1;
        uVar29 = *(ushort *)((long)puVar3 + (ulong)(uVar17 + iVar12 & 0xfffffffe));
        uVar28 = (ushort)(min >> 0x10);
        if (uVar29 < uVar28) {
          uVar17 = uVar23 + 1;
          bVar32 = true;
        }
        else if (uVar28 < uVar29) {
          iVar12 = uVar23 - 1;
          bVar32 = true;
        }
        else {
          bVar32 = false;
          prVar20 = (roaring_bitmap_t *)(ulong)uVar23;
        }
        uVar23 = (uint)prVar20;
      } while (bVar32);
      uVar23 = (int)uVar23 >> 0x1f ^ uVar23;
    }
    iVar12 = (uVar9 - uVar18) - uVar23;
    local_5c = uVar5;
    local_40 = min;
    local_3c = max;
    if (iVar12 <= (int)(uVar5 - uVar30)) {
      ra_shift_tail(&r->high_low_container,uVar18,((uVar5 - uVar30) - iVar12) + 1);
    }
    if (local_5c != uVar30 - 1) {
      uVar9 = (uVar23 + iVar12) - 1;
      local_40 = local_40 & 0xffff;
      local_3c = local_3c & 0xffff;
      lVar13 = (long)(int)(~uVar18 + (r->high_low_container).size);
      uVar18 = local_5c;
      local_70 = uVar25;
      do {
        uVar5 = 0;
        if ((uint)uVar25 == uVar18) {
          uVar5 = local_40;
        }
        uVar23 = 0xffff;
        if (local_5c == uVar18) {
          uVar23 = local_3c;
        }
        if (((int)uVar9 < 0) ||
           (uVar25 = (ulong)uVar9, uVar18 != (r->high_low_container).keys[uVar25])) {
          if (uVar23 + 1 < uVar5) {
            __assert_fail("range_end >= range_start",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1131,
                          "container_t *container_range_of_ones(uint32_t, uint32_t, uint8_t *)");
          }
          if ((uVar23 - uVar5) + 2 < 3) {
            local_75 = '\x02';
            paVar7 = array_container_create_range(uVar5,uVar23 + 1);
            uVar25 = local_70;
          }
          else {
            local_75 = '\x03';
            paVar7 = (array_container_t *)run_container_create_given_capacity(1);
            uVar25 = local_70;
            if (paVar7 != (array_container_t *)0x0) {
              iVar12 = paVar7->cardinality;
              *(uint *)(paVar7->array + (long)iVar12 * 2) = (uVar23 - uVar5) * 0x10000 | uVar5;
              paVar7->cardinality = iVar12 + 1;
            }
          }
        }
        else {
          if ((r->high_low_container).size <= (int)(uVar9 & 0xffff)) {
            __assert_fail("i < ra->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1a95,"void ra_unshare_container_at_index(roaring_array_t *, uint16_t)")
            ;
          }
          uVar30 = uVar9 & 0xffff;
          puVar4 = (r->high_low_container).typecodes;
          sc = (shared_container_t *)(r->high_low_container).containers[uVar30];
          local_74 = uVar9;
          local_50 = uVar25;
          if (puVar4[uVar30] == '\x04') {
            sc = (shared_container_t *)shared_container_extract_copy(sc,puVar4 + uVar30);
          }
          (r->high_low_container).containers[uVar30] = sc;
          paVar7 = (array_container_t *)(r->high_low_container).containers[local_50];
          uVar1 = (r->high_low_container).typecodes[local_50];
          uVar28 = (ushort)uVar23;
          uVar29 = (ushort)uVar5;
          local_68 = paVar7;
          if (uVar1 == '\x03') {
            puVar3 = paVar7->array;
            iVar12 = paVar7->cardinality;
            uVar9 = 0;
            iVar27 = 0;
            if (iVar12 != 0) {
              iVar19 = iVar12 + -1;
              iVar26 = 0;
              do {
                if (iVar19 < iVar26) {
                  iVar27 = iVar12 - iVar26;
                  break;
                }
                uVar30 = (uint)(iVar26 + iVar19) >> 1;
                if ((ushort)(puVar3[(ulong)uVar30 * 2 + 1] + puVar3[(ulong)uVar30 * 2]) < uVar28) {
                  iVar26 = uVar30 + 1;
                  bVar32 = true;
                }
                else if (uVar23 + 1 < (uint)puVar3[(ulong)uVar30 * 2]) {
                  iVar19 = uVar30 - 1;
                  bVar32 = true;
                }
                else {
                  iVar27 = ~uVar30 + iVar12;
                  bVar32 = false;
                }
              } while (bVar32);
            }
            iVar19 = iVar12 - iVar27;
            if (iVar19 != 0) {
              iVar26 = iVar19 + -1;
              uVar30 = uVar9;
              uVar17 = 0;
              do {
                uVar9 = uVar17;
                if (iVar26 < (int)uVar9) break;
                uVar21 = uVar9 + iVar26 >> 1;
                if ((ushort)(puVar3[(ulong)uVar21 * 2 + 1] + puVar3[(ulong)uVar21 * 2]) + 1 < uVar5)
                {
                  bVar32 = true;
                  uVar17 = uVar21 + 1;
                }
                else {
                  uVar17 = uVar9;
                  if (uVar29 < puVar3[(ulong)uVar21 * 2]) {
                    iVar26 = uVar21 - 1;
                    bVar32 = true;
                  }
                  else {
                    bVar32 = false;
                    uVar30 = uVar21;
                  }
                }
                uVar9 = uVar30;
                uVar30 = uVar9;
              } while (bVar32);
            }
            iVar26 = uVar9 + iVar27 + 1;
            if (iVar26 * 4 < 0x2001) {
              uVar25 = (ulong)(int)uVar9;
              if (iVar12 == uVar9 + iVar27) {
                if (paVar7->capacity <= iVar12) {
                  local_58 = uVar25;
                  run_container_grow((run_container_t *)paVar7,iVar12 + 1,true);
                  uVar25 = local_58;
                }
                uVar22 = uVar25 & 0xffff;
                memmove(paVar7->array + uVar22 * 2 + 2,paVar7->array + uVar22 * 2,
                        ((long)paVar7->cardinality - uVar22) * 4);
                local_68->cardinality = local_68->cardinality + 1;
                puVar3 = local_68->array;
                puVar3[uVar25 * 2] = uVar29;
                puVar3[uVar25 * 2 + 1] = uVar28 - uVar29;
              }
              else {
                __src = puVar3 + (long)iVar19 * 2;
                if (puVar3[uVar25 * 2] < uVar5) {
                  uVar5 = (uint)puVar3[uVar25 * 2];
                }
                uVar30 = (uint)__src[-1] + (uint)__src[-2];
                if ((uint)__src[-1] + (uint)__src[-2] <= uVar23) {
                  uVar30 = uVar23;
                }
                puVar3[uVar25 * 2] = (uint16_t)uVar5;
                puVar3[uVar25 * 2 + 1] = (short)uVar30 - (uint16_t)uVar5;
                memmove(puVar3 + (long)(int)(uVar9 + 1) * 2,__src,(long)iVar27 << 2);
                local_68->cardinality = iVar26;
              }
              local_75 = '\x03';
              paVar7 = local_68;
            }
            else {
              paVar7 = (array_container_t *)
                       container_from_run_range((run_container_t *)paVar7,uVar5,uVar23,&local_75);
            }
          }
          else {
            bVar31 = (byte)uVar23;
            bVar8 = (byte)uVar5;
            if (uVar1 == '\x02') {
              uVar9 = paVar7->cardinality;
              uVar17 = 0;
              uVar30 = 0;
              if (uVar9 != 0) {
                iVar12 = uVar9 - 1;
                uVar30 = 0;
                uVar25 = local_50;
                do {
                  if (iVar12 < (int)uVar30) {
                    uVar21 = ~uVar30;
                    break;
                  }
                  uVar21 = uVar30 + iVar12 >> 1;
                  uVar2 = *(ushort *)((long)paVar7->array + (ulong)(uVar30 + iVar12 & 0xfffffffe));
                  if (uVar2 < uVar28) {
                    uVar30 = uVar21 + 1;
                    bVar32 = true;
                  }
                  else if (uVar28 < uVar2) {
                    iVar12 = uVar21 - 1;
                    bVar32 = true;
                  }
                  else {
                    bVar32 = false;
                    uVar25 = (ulong)uVar21;
                  }
                  uVar21 = (uint)uVar25;
                } while (bVar32);
                uVar30 = uVar21 + 1;
                if (-1 < (int)uVar21) {
                  uVar30 = ~uVar21;
                }
                uVar30 = uVar30 + uVar9;
              }
              if (uVar9 != uVar30) {
                iVar12 = uVar9 + ~uVar30;
                uVar9 = 0;
                paVar15 = paVar7;
                do {
                  if (iVar12 < (int)uVar9) {
                    uVar17 = ~uVar9;
                    break;
                  }
                  uVar17 = uVar9 + iVar12 >> 1;
                  paVar16 = (array_container_t *)(ulong)uVar17;
                  uVar28 = *(ushort *)((long)paVar7->array + (ulong)(uVar9 + iVar12 & 0xfffffffe));
                  if (uVar28 < uVar29) {
                    uVar9 = uVar17 + 1;
                    bVar32 = true;
                    paVar16 = paVar15;
                  }
                  else if (uVar29 < uVar28) {
                    iVar12 = uVar17 - 1;
                    bVar32 = true;
                    paVar16 = paVar15;
                  }
                  else {
                    bVar32 = false;
                  }
                  uVar17 = (uint)paVar16;
                  paVar15 = paVar16;
                } while (bVar32);
                uVar17 = (int)uVar17 >> 0x1f ^ uVar17;
              }
              uVar25 = (ulong)(uVar23 - uVar5);
              iVar12 = (uVar23 - uVar5) + uVar17 + uVar30 + 1;
              if (iVar12 == 0x10000) {
LAB_001125f7:
                local_75 = '\x03';
                paVar7 = (array_container_t *)run_container_create_given_capacity(1);
                if (paVar7 == (array_container_t *)0x0) goto LAB_00112751;
                puVar3 = paVar7->array;
                iVar12 = paVar7->cardinality;
                (puVar3 + (long)iVar12 * 2)[0] = 0;
                (puVar3 + (long)iVar12 * 2)[1] = 0xffff;
                iVar6 = iVar12 + 1;
              }
              else {
                local_58 = CONCAT44(local_58._4_4_,iVar12);
                if (0x1000 < iVar12) {
                  local_75 = '\x01';
                  local_48 = uVar25;
                  local_68 = (array_container_t *)bitset_container_from_array(paVar7);
                  puVar3 = local_68->array;
                  uVar5 = uVar5 >> 6;
                  uVar23 = uVar23 >> 6;
                  if (uVar23 - uVar5 == 0) {
                    *(ulong *)(puVar3 + (ulong)uVar5 * 4) =
                         *(ulong *)(puVar3 + (ulong)uVar5 * 4) |
                         (0xffffffffffffffffU >> (0x3fU - (char)local_48 & 0x3f)) << (bVar8 & 0x3f);
                  }
                  else {
                    uVar22 = (ulong)uVar23;
                    uVar25 = *(ulong *)(puVar3 + uVar22 * 4);
                    *(ulong *)(puVar3 + (ulong)uVar5 * 4) =
                         *(ulong *)(puVar3 + (ulong)uVar5 * 4) | -1L << (bVar8 & 0x3f);
                    if (uVar5 + 1 < uVar23) {
                      local_48 = uVar22;
                      memset(puVar3 + (ulong)uVar5 * 4 + 4,0xff,
                             (ulong)((uVar23 - uVar5) - 2 >> 1) * 0x10 + 0x10);
                      uVar22 = local_48;
                    }
                    *(ulong *)(puVar3 + uVar22 * 4) =
                         uVar25 | 0xffffffffffffffffU >> (~bVar31 & 0x3f);
                  }
                  local_68->cardinality = (int32_t)local_58;
                  paVar7 = local_68;
                  goto LAB_00112751;
                }
                local_75 = '\x02';
                if (paVar7->capacity < iVar12) {
                  local_48 = uVar25;
                  array_container_grow(paVar7,iVar12,true);
                  uVar25 = local_48;
                }
                memmove(local_68->array + (int)((int)uVar25 + uVar17 + 1),
                        local_68->array + ((long)local_68->cardinality - (long)(int)uVar30),
                        (long)(int)uVar30 * 2);
                puVar3 = local_68->array;
                lVar10 = (uVar25 & 0xffffffff) + 1;
                do {
                  puVar3[uVar17] = (uint16_t)uVar5;
                  uVar17 = uVar17 + 1;
                  uVar5 = uVar5 + 1;
                  lVar10 = lVar10 + -1;
                } while (lVar10 != 0);
                paVar7 = local_68;
                iVar6 = (int32_t)local_58;
              }
              paVar7->cardinality = iVar6;
            }
            else {
              uVar9 = uVar23 - uVar5;
              puVar3 = paVar7->array;
              uVar5 = uVar5 >> 6;
              uVar25 = (ulong)uVar5;
              uVar23 = uVar23 >> 6;
              if (uVar23 == uVar5) {
                uVar22 = *(ulong *)(puVar3 + uVar25 * 4) &
                         (0xffffffffffffffffU >> (0x3fU - (char)uVar9 & 0x3f)) << (bVar8 & 0x3f);
                uVar22 = uVar22 - (uVar22 >> 1 & 0x5555555555555555);
                uVar22 = (uVar22 >> 2 & 0x3333333333333333) + (uVar22 & 0x3333333333333333);
                uVar30 = (uint)(byte)(((uVar22 >> 4) + uVar22 & 0xf0f0f0f0f0f0f0f) *
                                      0x101010101010101 >> 0x38);
              }
              else {
                uVar22 = (*(ulong *)(puVar3 + uVar25 * 4) >> (bVar8 & 0x3f)) << (bVar8 & 0x3f);
                uVar22 = uVar22 - (uVar22 >> 1 & 0x5555555555555555);
                uVar22 = (uVar22 >> 2 & 0x3333333333333333) + (uVar22 & 0x3333333333333333);
                uVar22 = ((uVar22 >> 4) + uVar22 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
                uVar11 = uVar22 >> 0x38;
                uVar30 = (uint)(byte)(uVar22 >> 0x38);
                local_48 = CONCAT44(local_48._4_4_,uVar23);
                if (uVar5 + 1 < uVar23) {
                  uVar22 = (ulong)(uVar5 + 1);
                  do {
                    uVar24 = *(ulong *)(puVar3 + uVar22 * 4) -
                             (*(ulong *)(puVar3 + uVar22 * 4) >> 1 & 0x5555555555555555);
                    uVar24 = (uVar24 >> 2 & 0x3333333333333333) + (uVar24 & 0x3333333333333333);
                    uVar30 = (int)uVar11 +
                             (uint)(byte)(((uVar24 >> 4) + uVar24 & 0xf0f0f0f0f0f0f0f) *
                                          0x101010101010101 >> 0x38);
                    uVar11 = (ulong)uVar30;
                    uVar22 = uVar22 + 1;
                  } while (uVar23 != uVar22);
                }
                uVar22 = (ulong)(*(long *)(puVar3 + (ulong)uVar23 * 4) << (~bVar31 & 0x3f)) >>
                         (~bVar31 & 0x3f);
                uVar22 = uVar22 - (uVar22 >> 1 & 0x5555555555555555);
                uVar22 = (uVar22 >> 2 & 0x3333333333333333) + (uVar22 & 0x3333333333333333);
                uVar30 = (byte)(((uVar22 >> 4) + uVar22 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                               0x38) + uVar30;
                local_58 = uVar25;
                local_38 = (ulong)uVar9;
              }
              iVar12 = (uVar9 + paVar7->cardinality + 1) - uVar30;
              if (iVar12 == 0x10000) goto LAB_001125f7;
              local_75 = '\x01';
              if (uVar23 - uVar5 == 0) {
                *(ulong *)(puVar3 + uVar25 * 4) =
                     *(ulong *)(puVar3 + uVar25 * 4) |
                     (0xffffffffffffffffU >> (0x3fU - (char)uVar9 & 0x3f)) << (bVar8 & 0x3f);
              }
              else {
                uVar11 = (ulong)uVar23;
                uVar22 = *(ulong *)(puVar3 + uVar11 * 4);
                *(ulong *)(puVar3 + uVar25 * 4) =
                     *(ulong *)(puVar3 + uVar25 * 4) | -1L << (bVar8 & 0x3f);
                if (uVar5 + 1 < uVar23) {
                  local_58 = uVar11;
                  local_48 = uVar22;
                  memset(puVar3 + uVar25 * 4 + 4,0xff,
                         (ulong)((uVar23 - uVar5) - 2 >> 1) * 0x10 + 0x10);
                  uVar11 = local_58;
                  uVar22 = local_48;
                }
                *(ulong *)(puVar3 + uVar11 * 4) = uVar22 | 0xffffffffffffffffU >> (~bVar31 & 0x3f);
              }
              local_68->cardinality = iVar12;
              paVar7 = local_68;
            }
          }
LAB_00112751:
          uVar25 = local_70;
          uVar9 = local_74;
          paVar15 = (array_container_t *)(r->high_low_container).containers[local_50];
          if (paVar7 != paVar15) {
            container_free(paVar15,(r->high_low_container).typecodes[local_50]);
          }
          uVar9 = uVar9 - 1;
        }
        if ((r->high_low_container).size <= lVar13) {
          __assert_fail("i < ra->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1a55,
                        "void ra_replace_key_and_container_at_index(roaring_array_t *, int32_t, uint16_t, container_t *, uint8_t)"
                       );
        }
        (r->high_low_container).keys[lVar13] = (uint16_t)uVar18;
        (r->high_low_container).containers[lVar13] = paVar7;
        (r->high_low_container).typecodes[lVar13] = local_75;
        lVar13 = lVar13 + -1;
        bVar32 = uVar18 != (uint)uVar25;
        uVar18 = uVar18 - 1;
      } while (bVar32);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_add_range_closed(roaring_bitmap_t *r, uint32_t min, uint32_t max) {
    if (min > max) {
        return;
    }

    roaring_array_t *ra = &r->high_low_container;

    uint32_t min_key = min >> 16;
    uint32_t max_key = max >> 16;

    int32_t num_required_containers = max_key - min_key + 1;
    int32_t suffix_length = count_greater(ra->keys, ra->size, max_key);
    int32_t prefix_length = count_less(ra->keys, ra->size - suffix_length,
                                       min_key);
    int32_t common_length = ra->size - prefix_length - suffix_length;

    if (num_required_containers > common_length) {
        ra_shift_tail(ra, suffix_length,
                      num_required_containers - common_length);
    }

    int32_t src = prefix_length + common_length - 1;
    int32_t dst = ra->size - suffix_length - 1;
    for (uint32_t key = max_key; key != min_key-1; key--) { // beware of min_key==0
        uint32_t container_min = (min_key == key) ? (min & 0xffff) : 0;
        uint32_t container_max = (max_key == key) ? (max & 0xffff) : 0xffff;
        container_t* new_container;
        uint8_t new_type;

        if (src >= 0 && ra->keys[src] == key) {
            ra_unshare_container_at_index(ra, src);
            new_container = container_add_range(ra->containers[src],
                                                ra->typecodes[src],
                                                container_min, container_max,
                                                &new_type);
            if (new_container != ra->containers[src]) {
                container_free(ra->containers[src],
                               ra->typecodes[src]);
            }
            src--;
        } else {
            new_container = container_from_range(&new_type, container_min,
                                                 container_max+1, 1);
        }
        ra_replace_key_and_container_at_index(ra, dst, key, new_container,
                                              new_type);
        dst--;
    }
}